

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cpp
# Opt level: O1

bool MeCab::Dictionary::assignUserDictionaryCosts
               (Param *param,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *dics,char *output)

{
  char *pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  ostream *poVar9;
  size_t sVar10;
  pointer pbVar11;
  long *plVar12;
  char *pcVar13;
  int __oflag;
  int extraout_EDX;
  int extraout_EDX_00;
  char *pcVar14;
  char **ppcVar15;
  char *pcVar16;
  char *pcVar17;
  long lVar18;
  ulong uVar19;
  char *pcVar20;
  char *tmpstr;
  string w;
  Iconv config_iconv;
  string rfeature;
  string lfeature;
  string ufeature;
  string feature;
  string from;
  string config_charset;
  string dicdir;
  string right_id_file;
  string left_id_file;
  ContextID cid;
  string rewrite_file;
  string matrix_bin_file;
  string matrix_file;
  DictionaryRewriter rewriter;
  char *col [8];
  ifstream ifs;
  Connector matrix;
  ofstream ofs;
  DecoderFeatureIndex fi;
  CharProperty property;
  die local_e85;
  die local_e84;
  die local_e83;
  die local_e82;
  die local_e81;
  char *local_e80;
  int local_e74;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_e70;
  string local_e68;
  _func_int **local_e48;
  Iconv local_e40;
  string local_e30;
  string local_e10;
  string local_df0;
  string local_dd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_db0;
  ulong local_d90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d68;
  string local_d48;
  string local_d28;
  ContextID local_d08;
  string local_c68;
  string local_c48;
  string local_c28;
  DictionaryRewriter local_c08;
  char *local_b88 [4];
  char *local_b68;
  string local_b48;
  byte abStack_b28 [488];
  Connector local_940;
  long local_780;
  filebuf local_778 [24];
  byte abStack_760 [216];
  ios_base local_688 [264];
  DecoderFeatureIndex local_580;
  CharProperty local_208;
  
  local_e70 = dics;
  Connector::Connector(&local_940);
  local_c08.cache_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_c08.cache_._M_t._M_impl.super__Rb_tree_header._M_header;
  local_c08.cache_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c08.cache_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c08.unigram_rewrite_.
  super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
  super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c08.unigram_rewrite_.
  super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
  super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c08.unigram_rewrite_.
  super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
  super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c08.left_rewrite_.
  super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
  super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c08.left_rewrite_.
  super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
  super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c08.left_rewrite_.
  super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
  super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c08.right_rewrite_.
  super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
  super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c08.right_rewrite_.
  super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
  super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c08.right_rewrite_.
  super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
  super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c08.cache_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_580.super_FeatureIndex.rewrite_.cache_._M_t._M_impl.super__Rb_tree_header._M_header._M_left
       = (_Base_ptr)((long)&local_580.super_FeatureIndex.rewrite_.cache_._M_t._M_impl + 8);
  local_580.super_FeatureIndex.feature_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_580.super_FeatureIndex.feature_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_580.super_FeatureIndex.feature_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_580.super_FeatureIndex.feature_freelist_._vptr_ChunkFreeList =
       (_func_int **)&PTR__ChunkFreeList_00172f98;
  local_580.super_FeatureIndex.feature_freelist_.freelist_.
  super__Vector_base<std::pair<unsigned_long,_int_*>,_std::allocator<std::pair<unsigned_long,_int_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_580.super_FeatureIndex.feature_freelist_.freelist_.
  super__Vector_base<std::pair<unsigned_long,_int_*>,_std::allocator<std::pair<unsigned_long,_int_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_580.super_FeatureIndex.feature_freelist_.freelist_.
  super__Vector_base<std::pair<unsigned_long,_int_*>,_std::allocator<std::pair<unsigned_long,_int_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_580.super_FeatureIndex.feature_freelist_.pi_ = 0;
  local_580.super_FeatureIndex.feature_freelist_.li_ = 0;
  local_580.super_FeatureIndex.feature_freelist_.default_size = 0x40000;
  local_580.super_FeatureIndex.char_freelist_._vptr_ChunkFreeList =
       (_func_int **)&PTR__ChunkFreeList_00172ab8;
  local_580.super_FeatureIndex.char_freelist_.freelist_.
  super__Vector_base<std::pair<unsigned_long,_char_*>,_std::allocator<std::pair<unsigned_long,_char_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_580.super_FeatureIndex.char_freelist_.freelist_.
  super__Vector_base<std::pair<unsigned_long,_char_*>,_std::allocator<std::pair<unsigned_long,_char_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_580.super_FeatureIndex.char_freelist_.freelist_.
  super__Vector_base<std::pair<unsigned_long,_char_*>,_std::allocator<std::pair<unsigned_long,_char_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_580.super_FeatureIndex.char_freelist_.pi_ = 0;
  local_580.super_FeatureIndex.char_freelist_.li_ = 0;
  local_580.super_FeatureIndex.char_freelist_.default_size = 0x40000;
  local_580.super_FeatureIndex.rewrite_.cache_._M_t._M_impl.super__Rb_tree_header._M_header._M_color
       = _S_red;
  local_580.super_FeatureIndex.rewrite_.cache_._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_parent = (_Base_ptr)0x0;
  local_580.super_FeatureIndex.unigram_templs_.
  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_580.super_FeatureIndex.unigram_templs_.
  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_580.super_FeatureIndex.unigram_templs_.
  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_580.super_FeatureIndex.bigram_templs_.
  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_580.super_FeatureIndex.bigram_templs_.
  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_580.super_FeatureIndex.bigram_templs_.
  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_580.super_FeatureIndex.rewrite_.unigram_rewrite_.
  super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
  super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_580.super_FeatureIndex.rewrite_.unigram_rewrite_.
  super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
  super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_580.super_FeatureIndex.rewrite_.unigram_rewrite_.
  super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
  super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_580.super_FeatureIndex.rewrite_.left_rewrite_.
  super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
  super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_580.super_FeatureIndex.rewrite_.left_rewrite_.
  super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
  super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_580.super_FeatureIndex.rewrite_.left_rewrite_.
  super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
  super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_580.super_FeatureIndex.rewrite_.right_rewrite_.
  super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
  super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_580.super_FeatureIndex.rewrite_.right_rewrite_.
  super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
  super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_580.super_FeatureIndex.rewrite_.right_rewrite_.
  super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
  super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_580.super_FeatureIndex.rewrite_.cache_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_580.super_FeatureIndex.os_._vptr_StringBuffer = (_func_int **)&PTR__StringBuffer_00173118;
  local_580.super_FeatureIndex.os_.size_ = 0;
  local_580.super_FeatureIndex.os_.alloc_size_ = 0;
  local_580.super_FeatureIndex.os_.ptr_ = (char *)0x0;
  local_580.super_FeatureIndex.os_.is_delete_ = true;
  local_580.super_FeatureIndex.os_.error_ = false;
  local_580.super_FeatureIndex.maxid_ = 0;
  local_580.super_FeatureIndex.alpha_ = (double *)0x0;
  local_e48 = (_func_int **)&PTR_open_00173088;
  local_580.super_FeatureIndex._vptr_FeatureIndex = (_func_int **)&PTR_open_00173088;
  local_c08.cache_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_c08.cache_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_580.super_FeatureIndex.rewrite_.cache_._M_t._M_impl.super__Rb_tree_header._M_header._M_right
       = local_580.super_FeatureIndex.rewrite_.cache_._M_t._M_impl.super__Rb_tree_header._M_header.
         _M_left;
  Mmap<char>::Mmap(&local_580.mmap_);
  local_580.model_buffer_._M_dataplus._M_p = (pointer)&local_580.model_buffer_.field_2;
  local_580.model_buffer_._M_string_length = 0;
  local_580.model_buffer_.field_2._M_local_buf[0] = '\0';
  local_d08.left_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_d08.left_._M_t._M_impl.super__Rb_tree_header._M_header;
  local_d08.left_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_d08.left_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_d08.left_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_d08.right_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_d08.right_._M_t._M_impl.super__Rb_tree_header._M_header;
  local_d08.right_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_d08.right_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_d08.right_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_d08.left_bos_._M_dataplus._M_p = (pointer)&local_d08.left_bos_.field_2;
  local_d08.left_bos_._M_string_length = 0;
  local_d08.left_bos_.field_2._M_local_buf[0] = '\0';
  local_d08.right_bos_._M_dataplus._M_p = (pointer)&local_d08.right_bos_.field_2;
  local_d08.right_bos_._M_string_length = 0;
  local_d08.right_bos_.field_2._M_local_buf[0] = '\0';
  local_d08.left_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_d08.left_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_d08.right_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_d08.right_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  CharProperty::CharProperty(&local_208);
  Param::get<std::__cxx11::string>(&local_d68,param,"dicdir");
  paVar2 = &local_b48.field_2;
  local_b48._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b48,"matrix.def","");
  create_filename(&local_c28,&local_d68,&local_b48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b48._M_dataplus._M_p != paVar2) {
    operator_delete(local_b48._M_dataplus._M_p);
  }
  local_b48._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b48,"matrix.bin","");
  create_filename(&local_c48,&local_d68,&local_b48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b48._M_dataplus._M_p != paVar2) {
    operator_delete(local_b48._M_dataplus._M_p);
  }
  local_b48._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b48,"left-id.def","");
  create_filename(&local_d28,&local_d68,&local_b48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b48._M_dataplus._M_p != paVar2) {
    operator_delete(local_b48._M_dataplus._M_p);
  }
  local_b48._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b48,"right-id.def","");
  create_filename(&local_d48,&local_d68,&local_b48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b48._M_dataplus._M_p != paVar2) {
    operator_delete(local_b48._M_dataplus._M_p);
  }
  local_b48._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b48,"rewrite.def","");
  create_filename(&local_c68,&local_d68,&local_b48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b48._M_dataplus._M_p != paVar2) {
    operator_delete(local_b48._M_dataplus._M_p);
  }
  Param::get<std::__cxx11::string>(&local_db0,param,"dictionary-charset");
  iVar5 = Param::get<int>(param,"cost-factor");
  if (iVar5 < 1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
               ,0x70);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x9b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"factor > 0",10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"] ",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"cost factor needs to be positive value",0x26);
    die::~die((die *)&local_b48);
  }
  Param::get<std::__cxx11::string>(&local_d88,param,"config-charset");
  if (local_d88._M_string_length == 0) {
    std::__cxx11::string::_M_assign((string *)&local_d88);
  }
  if (local_db0._M_string_length == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
               ,0x70);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xa2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"!from.empty()",0xd);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"] ",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"input dictionary charset is empty",0x21);
    die::~die((die *)&local_b48);
  }
  local_e74 = iVar5;
  Iconv::Iconv(&local_e40);
  iVar5 = Iconv::open(&local_e40,local_d88._M_dataplus._M_p,(int)local_db0._M_dataplus._M_p);
  if ((char)iVar5 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
               ,0x70);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xa5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"config_iconv.open(config_charset.c_str(), from.c_str())",0x37);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"] ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"iconv_open() failed with from=",0x1e)
    ;
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,local_d88._M_dataplus._M_p,local_d88._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," to=",4);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,local_db0._M_dataplus._M_p,local_db0._M_string_length);
    die::~die(&local_e81);
  }
  DictionaryRewriter::open(&local_c08,local_c68._M_dataplus._M_p,(int)&local_e40);
  iVar6 = DecoderFeatureIndex::open(&local_580,(char *)param,__oflag);
  iVar5 = extraout_EDX;
  if ((char)iVar6 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
               ,0x70);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xa9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"fi.open(param)",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"] ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"cannot open feature index",0x19);
    die::~die(&local_e82);
    iVar5 = extraout_EDX_00;
  }
  iVar5 = CharProperty::open(&local_208,(char *)param,iVar5);
  if ((char)iVar5 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
               ,0x70);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xab);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"property.open(param)",0x14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"] ",2);
    die::~die(&local_e83);
  }
  CharProperty::set_charset(&local_208,local_db0._M_dataplus._M_p);
  bVar4 = Connector::openText(&local_940,local_c28._M_dataplus._M_p);
  if ((!bVar4) &&
     (iVar5 = Connector::open(&local_940,local_c48._M_dataplus._M_p,0x15cd37), (char)iVar5 == '\0'))
  {
    local_940.lsize_ = 1;
    local_940.rsize_ = 1;
  }
  ContextID::open(&local_d08,local_d28._M_dataplus._M_p,(int)local_d48._M_dataplus._M_p,&local_e40);
  iVar5 = local_e74;
  if ((local_d08.left_._M_t._M_impl.super__Rb_tree_header._M_node_count != local_940.lsize_) ||
     (local_d08.right_._M_t._M_impl.super__Rb_tree_header._M_node_count != local_940.rsize_)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
               ,0x70);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xb7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,
               "cid.left_size() == matrix.left_size() && cid.right_size() == matrix.right_size()",
               0x50);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"] ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"Context ID files(",0x11);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,local_d28._M_dataplus._M_p,local_d28._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," or ",4);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,local_d48._M_dataplus._M_p,local_d48._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," may be broken: ",0x10);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
    die::~die((die *)&local_b48);
  }
  std::ofstream::ofstream(&local_780,output,_S_out);
  if ((abStack_760[*(long *)(local_780 + -0x18)] & 5) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
               ,0x70);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xc0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"ofs",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"] ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"permission denied: ",0x13);
    if (output == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar10 = strlen(output);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,output,sVar10);
    }
    die::~die((die *)&local_b48);
  }
  pbVar11 = (local_e70->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((local_e70->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != pbVar11) {
    uVar19 = 0;
    do {
      local_d90 = uVar19;
      std::ifstream::ifstream(&local_b48,pbVar11[uVar19]._M_dataplus._M_p,_S_in);
      if ((abStack_b28[*(long *)(local_b48._M_dataplus._M_p + -0x18)] & 5) != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                   ,0x70);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
        poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xc4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,") [",3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"ifs",3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"] ",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar9,"no such file or directory: ",0x1b);
        pbVar11 = (local_e70->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar9,pbVar11[uVar19]._M_dataplus._M_p,pbVar11[uVar19]._M_string_length);
        die::~die((die *)local_b88);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"reading ",8);
      pbVar11 = (local_e70->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,pbVar11[uVar19]._M_dataplus._M_p,
                          pbVar11[uVar19]._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9," ... ",5);
      local_e80 = (char *)operator_new__(0x2000);
      while( true ) {
        std::ios::widen((char)*(undefined8 *)(local_b48._M_dataplus._M_p + -0x18) + (char)&local_b48
                       );
        plVar12 = (long *)std::istream::getline((char *)&local_b48,(long)local_e80,'\0');
        pcVar17 = local_e80;
        if ((*(byte *)((long)plVar12 + *(long *)(*plVar12 + -0x18) + 0x20) & 5) != 0) break;
        sVar10 = strlen(local_e80);
        if ((sVar10 != 0) && (pcVar17[sVar10 - 1] == '\r')) {
          pcVar17[sVar10 - 1] = '\0';
        }
        sVar10 = strlen(pcVar17);
        if ((long)sVar10 < 1) {
LAB_0013524d:
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                     ,0x70);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
          poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xd8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,") [",3);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"n == 5",6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"] ",2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"format error: ",0xe);
          pcVar17 = local_e80;
          sVar10 = strlen(local_e80);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar17,sVar10);
          die::~die((die *)&local_e68);
        }
        else {
          pcVar20 = local_e80 + sVar10;
          uVar19 = 5;
          lVar18 = 0;
          ppcVar15 = local_b88;
          pcVar17 = local_e80;
          do {
            for (; (cVar3 = *pcVar17, cVar3 == '\t' || (cVar3 == ' ')); pcVar17 = pcVar17 + 1) {
            }
            if (cVar3 == '\"') {
              pcVar17 = pcVar17 + 1;
              pcVar14 = pcVar17;
              for (pcVar13 = pcVar17;
                  (pcVar16 = pcVar13, pcVar13 < pcVar20 &&
                  ((*pcVar13 != '\"' ||
                   (pcVar16 = pcVar13 + 1, pcVar1 = pcVar13 + 1, pcVar13 = pcVar16, *pcVar1 == '\"')
                   ))); pcVar13 = pcVar13 + 1) {
                *pcVar14 = *pcVar13;
                pcVar14 = pcVar14 + 1;
              }
              local_e68._M_dataplus._M_p._0_1_ = 0x2c;
              pcVar13 = std::__find_if<char*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                                  (pcVar16,pcVar20,&local_e68);
            }
            else {
              local_e68._M_dataplus._M_p._0_1_ = 0x2c;
              pcVar13 = std::__find_if<char*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                                  (pcVar17,pcVar20,&local_e68);
              pcVar14 = pcVar13;
            }
            if (1 < uVar19) {
              *pcVar14 = '\0';
            }
            uVar19 = uVar19 - 1;
            *ppcVar15 = pcVar17;
            lVar18 = lVar18 + 1;
            if (uVar19 == 0) break;
            ppcVar15 = ppcVar15 + 1;
            pcVar17 = pcVar13 + 1;
          } while (pcVar17 < pcVar20);
          iVar5 = local_e74;
          if (lVar18 != 5) goto LAB_0013524d;
        }
        std::__cxx11::string::string((string *)&local_e68,local_b88[0],(allocator *)&local_dd0);
        std::__cxx11::string::string((string *)&local_dd0,local_b68,(allocator *)&local_df0);
        iVar6 = anon_unknown_0::calcCost
                          (&local_e68,&local_dd0,iVar5,&local_580,&local_c08,&local_208);
        local_df0._M_dataplus._M_p = (pointer)&local_df0.field_2;
        local_df0._M_string_length = 0;
        local_df0.field_2._M_local_buf[0] = '\0';
        local_e10._M_dataplus._M_p = (pointer)&local_e10.field_2;
        local_e10._M_string_length = 0;
        local_e10.field_2._M_local_buf[0] = '\0';
        local_e30._M_dataplus._M_p = (pointer)&local_e30.field_2;
        local_e30._M_string_length = 0;
        local_e30.field_2._M_local_buf[0] = '\0';
        bVar4 = DictionaryRewriter::rewrite(&local_c08,&local_dd0,&local_df0,&local_e10,&local_e30);
        if (!bVar4) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                     ,0x70);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
          poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xde);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,") [",3);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9,"rewriter.rewrite(feature, &ufeature, &lfeature, &rfeature)",0x3a);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"] ",2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"rewrite failed: ",0x10);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9,local_dd0._M_dataplus._M_p,local_dd0._M_string_length);
          if (!bVar4) {
            die::~die(&local_e84);
          }
        }
        uVar7 = ContextID::lid(&local_d08,local_e10._M_dataplus._M_p);
        uVar8 = ContextID::rid(&local_d08,local_e30._M_dataplus._M_p);
        if ((((int)(uVar8 | uVar7) < 0) || ((uint)local_940._32_4_ >> 0x10 <= uVar7)) ||
           ((local_940._32_4_ & 0xffff) <= uVar8)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                     ,0x70);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
          poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xe2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,") [",3);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9,"lid >= 0 && rid >= 0 && matrix.is_valid(lid, rid)",0x31);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"] ",2);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9,"invalid ids are found lid=",0x1a);
          poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,uVar7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9," rid=",5);
          std::ostream::operator<<((ostream *)poVar9,uVar8);
          die::~die(&local_e85);
        }
        escape_csv_element(&local_e68);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_780,
                            (char *)CONCAT71(local_e68._M_dataplus._M_p._1_7_,
                                             local_e68._M_dataplus._M_p._0_1_),
                            local_e68._M_string_length);
        local_e85 = (die)0x2c;
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)&local_e85,1);
        poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,uVar7);
        local_e85 = (die)0x2c;
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)&local_e85,1);
        poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,uVar8);
        local_e85 = (die)0x2c;
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)&local_e85,1);
        poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,iVar6);
        local_e85 = (die)0x2c;
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)&local_e85,1);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,local_dd0._M_dataplus._M_p,local_dd0._M_string_length);
        local_e85 = (die)0xa;
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)&local_e85,1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e30._M_dataplus._M_p != &local_e30.field_2) {
          operator_delete(local_e30._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e10._M_dataplus._M_p != &local_e10.field_2) {
          operator_delete(local_e10._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_df0._M_dataplus._M_p != &local_df0.field_2) {
          operator_delete(local_df0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_dd0._M_dataplus._M_p != &local_dd0.field_2) {
          operator_delete(local_dd0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_e68._M_dataplus._M_p._1_7_,local_e68._M_dataplus._M_p._0_1_) !=
            &local_e68.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_e68._M_dataplus._M_p._1_7_,local_e68._M_dataplus._M_p._0_1_
                                  ));
        }
      }
      operator_delete__(local_e80);
      std::ifstream::~ifstream(&local_b48);
      uVar19 = local_d90 + 1;
      pbVar11 = (local_e70->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
    } while (uVar19 < (ulong)((long)(local_e70->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar11 >> 5
                             ));
  }
  local_780 = _VTT;
  *(undefined8 *)(local_778 + *(long *)(_VTT + -0x18) + -8) = _log;
  std::filebuf::~filebuf(local_778);
  std::ios_base::~ios_base(local_688);
  Iconv::~Iconv(&local_e40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d88._M_dataplus._M_p != &local_d88.field_2) {
    operator_delete(local_d88._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_db0._M_dataplus._M_p != &local_db0.field_2) {
    operator_delete(local_db0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c68._M_dataplus._M_p != &local_c68.field_2) {
    operator_delete(local_c68._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d48._M_dataplus._M_p != &local_d48.field_2) {
    operator_delete(local_d48._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d28._M_dataplus._M_p != &local_d28.field_2) {
    operator_delete(local_d28._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c48._M_dataplus._M_p != &local_c48.field_2) {
    operator_delete(local_c48._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c28._M_dataplus._M_p != &local_c28.field_2) {
    operator_delete(local_c28._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d68._M_dataplus._M_p != &local_d68.field_2) {
    operator_delete(local_d68._M_dataplus._M_p);
  }
  CharProperty::~CharProperty(&local_208);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d08.right_bos_._M_dataplus._M_p != &local_d08.right_bos_.field_2) {
    operator_delete(local_d08.right_bos_._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d08.left_bos_._M_dataplus._M_p != &local_d08.left_bos_.field_2) {
    operator_delete(local_d08.left_bos_._M_dataplus._M_p);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree(&local_d08.right_._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *)&local_d08);
  local_580.super_FeatureIndex._vptr_FeatureIndex = local_e48;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_580.model_buffer_._M_dataplus._M_p != &local_580.model_buffer_.field_2) {
    operator_delete(local_580.model_buffer_._M_dataplus._M_p);
  }
  Mmap<char>::~Mmap(&local_580.mmap_);
  FeatureIndex::~FeatureIndex(&local_580.super_FeatureIndex);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::FeatureSet>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::FeatureSet>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::FeatureSet>_>_>
  ::~_Rb_tree(&local_c08.cache_._M_t);
  std::vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>::~vector
            (&local_c08.right_rewrite_.
              super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>);
  std::vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>::~vector
            (&local_c08.left_rewrite_.
              super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>);
  std::vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>::~vector
            ((vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_> *)&local_c08);
  Connector::~Connector(&local_940);
  return true;
}

Assistant:

bool Dictionary::assignUserDictionaryCosts(
    const Param &param,
    const std::vector<std::string> &dics,
    const char *output) {
  Connector matrix;
  DictionaryRewriter rewriter;
  DecoderFeatureIndex fi;
  ContextID cid;
  CharProperty property;

  const std::string dicdir = param.get<std::string>("dicdir");

  const std::string matrix_file     = DCONF(MATRIX_DEF_FILE);
  const std::string matrix_bin_file = DCONF(MATRIX_FILE);
  const std::string left_id_file    = DCONF(LEFT_ID_FILE);
  const std::string right_id_file   = DCONF(RIGHT_ID_FILE);
  const std::string rewrite_file    = DCONF(REWRITE_FILE);

  const std::string from = param.get<std::string>("dictionary-charset");

  const int factor = param.get<int>("cost-factor");
  CHECK_DIE(factor > 0)   << "cost factor needs to be positive value";

  std::string config_charset = param.get<std::string>("config-charset");
  if (config_charset.empty()) {
    config_charset = from;
  }

  CHECK_DIE(!from.empty()) << "input dictionary charset is empty";

  Iconv config_iconv;
  CHECK_DIE(config_iconv.open(config_charset.c_str(), from.c_str()))
      << "iconv_open() failed with from=" << config_charset << " to=" << from;

  rewriter.open(rewrite_file.c_str(), &config_iconv);
  CHECK_DIE(fi.open(param)) << "cannot open feature index";

  CHECK_DIE(property.open(param));
  property.set_charset(from.c_str());

  if (!matrix.openText(matrix_file.c_str()) &&
      !matrix.open(matrix_bin_file.c_str())) {
    matrix.set_left_size(1);
    matrix.set_right_size(1);
  }

  cid.open(left_id_file.c_str(),
           right_id_file.c_str(), &config_iconv);
  CHECK_DIE(cid.left_size()  == matrix.left_size() &&
            cid.right_size() == matrix.right_size())
      << "Context ID files("
      << left_id_file
      << " or "
      << right_id_file << " may be broken: "
      << cid.left_size() << " " << matrix.left_size() << " "
      << cid.right_size() << " " << matrix.right_size();

  std::ofstream ofs(output);
  CHECK_DIE(ofs) << "permission denied: " << output;

  for (size_t i = 0; i < dics.size(); ++i) {
    std::ifstream ifs(WPATH(dics[i].c_str()));
    CHECK_DIE(ifs) << "no such file or directory: " << dics[i];
    std::cout << "reading " << dics[i] << " ... ";
    scoped_fixed_array<char, BUF_SIZE> line;
    while (ifs.getline(line.get(), line.size())) {
#if 1 /* for Open JTalk */
      {
	/* if there is CR code, it should be removed */
	char *tmpstr = line.get();
	if(tmpstr != NULL){
	  size_t tmplen = strlen(tmpstr);
	  if(tmplen > 0){
	    if(tmpstr[tmplen-1] == '\r'){
	      tmpstr[tmplen-1] = '\0';
	    }
	  }
	}
      }
#endif
      char *col[8];
      const size_t n = tokenizeCSV(line.get(), col, 5);
      CHECK_DIE(n == 5) << "format error: " << line.get();
      std::string w = col[0];
      const std::string feature = col[4];
      const int cost = calcCost(w, feature, factor,
                                &fi, &rewriter, &property);
      std::string ufeature, lfeature, rfeature;
      CHECK_DIE(rewriter.rewrite(feature, &ufeature, &lfeature, &rfeature))
          << "rewrite failed: " << feature;
      const int lid = cid.lid(lfeature.c_str());
      const int rid = cid.rid(rfeature.c_str());
      CHECK_DIE(lid >= 0 && rid >= 0 && matrix.is_valid(lid, rid))
          << "invalid ids are found lid=" << lid << " rid=" << rid;
      escape_csv_element(&w);
      ofs << w << ',' << lid << ',' << rid << ','
          << cost << ',' << feature << '\n';
    }
  }

  return true;
}